

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  JOCTET *pJVar1;
  byte bVar2;
  code cVar3;
  undefined4 uVar4;
  jpeg_entropy_encoder *pjVar5;
  _func_void_j_compress_ptr *p_Var6;
  jpeg_error_mgr *pjVar7;
  jpeg_destination_mgr *pjVar8;
  bool bVar9;
  j_compress_ptr pjVar10;
  boolean bVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  _func_void_j_compress_ptr_boolean *p_Var22;
  working_state state;
  undefined1 local_b8 [28];
  int iStack_9c;
  _func_void_j_compress_ptr *local_98;
  _func_void_j_compress_ptr_boolean *p_Stack_90;
  j_compress_ptr local_88;
  ulong local_80;
  ulong local_78;
  _func_void_j_compress_ptr_boolean *local_70;
  JBLOCKROW *local_68;
  j_compress_ptr local_60;
  jpeg_entropy_encoder *local_58;
  long local_50;
  long local_48;
  int *local_40;
  JBLOCKROW local_38;
  
  pjVar5 = cinfo->entropy;
  local_b8._0_8_ = cinfo->dest->next_output_byte;
  local_b8._8_8_ = cinfo->dest->free_in_buffer;
  local_b8._16_8_ = pjVar5[1].start_pass;
  unique0x100003c5 = pjVar5[1].encode_mcu;
  local_98 = pjVar5[1].finish_pass;
  p_Stack_90 = pjVar5[2].start_pass;
  local_88 = cinfo;
  if ((cinfo->restart_interval != 0) && (*(int *)&pjVar5[2].encode_mcu == 0)) {
    uVar4 = *(undefined4 *)((long)&pjVar5[2].encode_mcu + 4);
    bVar11 = flush_bits_s((working_state *)local_b8);
    if (bVar11 == 0) {
      return 0;
    }
    pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
    *(JOCTET *)local_b8._0_8_ = 0xff;
    local_b8._8_8_ = local_b8._8_8_ - 1;
    local_b8._0_8_ = pJVar1;
    if (local_b8._8_8_ == 0) {
      pjVar8 = local_88->dest;
      bVar11 = (*pjVar8->empty_output_buffer)(local_88);
      if (bVar11 == 0) {
        return 0;
      }
      local_b8._0_8_ = pjVar8->next_output_byte;
      local_b8._8_8_ = pjVar8->free_in_buffer;
    }
    pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
    *(JOCTET *)local_b8._0_8_ = (char)uVar4 + 0xd0;
    local_b8._8_8_ = local_b8._8_8_ - 1;
    local_b8._0_8_ = pJVar1;
    if (local_b8._8_8_ == 0) {
      pjVar8 = local_88->dest;
      bVar11 = (*pjVar8->empty_output_buffer)(local_88);
      if (bVar11 == 0) {
        return 0;
      }
      local_b8._0_8_ = pjVar8->next_output_byte;
      local_b8._8_8_ = pjVar8->free_in_buffer;
    }
    pjVar10 = local_88;
    if (0 < local_88->comps_in_scan) {
      lVar13 = 0;
      do {
        (&iStack_9c)[lVar13] = 0;
        lVar13 = lVar13 + 1;
      } while (lVar13 < pjVar10->comps_in_scan);
    }
  }
  local_58 = pjVar5;
  if (0 < cinfo->blocks_in_MCU) {
    local_48 = 0;
    local_60 = cinfo;
    local_68 = MCU_data;
    do {
      local_50 = (long)local_60->MCU_membership[local_48];
      local_38 = MCU_data[local_48];
      iVar17 = (int)(*MCU_data[local_48])[0];
      iVar12 = (&iStack_9c)[local_50];
      uVar19 = 0;
      uVar18 = iVar17 - iVar12;
      if (uVar18 != 0) {
        uVar15 = -uVar18;
        if (0 < (int)uVar18) {
          uVar15 = uVar18;
        }
        uVar19 = 0;
        uVar14 = (ulong)uVar15;
        do {
          uVar19 = uVar19 + 1;
          uVar14 = uVar14 >> 1;
          bVar9 = 1 < uVar15;
          uVar15 = (uint)uVar14;
        } while (bVar9);
      }
      p_Var6 = (&local_58[2].finish_pass)[local_60->cur_comp_info[local_50]->dc_tbl_no];
      local_70 = (&local_58[4].start_pass)[local_60->cur_comp_info[local_50]->ac_tbl_no];
      local_80 = (ulong)(uint)local_88->lim_Se;
      local_40 = local_88->natural_order;
      if (0xb < uVar19) {
        pjVar7 = local_88->err;
        pjVar7->msg_code = 6;
        (*pjVar7->error_exit)((j_common_ptr)local_88);
      }
      local_78 = (ulong)uVar19;
      uVar15 = *(uint *)(p_Var6 + local_78 * 4);
      bVar2 = (byte)p_Var6[local_78 + 0x400];
      uVar4 = local_b8._24_4_;
      if (bVar2 == 0) {
        pjVar7 = local_88->err;
        pjVar7->msg_code = 0x29;
        (*pjVar7->error_exit)((j_common_ptr)local_88);
      }
      p_Var22 = (_func_void_j_compress_ptr_boolean *)
                ((ulong)(uVar15 & ~(uint)(-1L << (bVar2 & 0x3f))) <<
                 (0x18U - (char)(uVar4 + (int)(char)bVar2) & 0x3f) | local_b8._16_8_);
      iVar21 = uVar4 + (int)(char)bVar2;
      do {
        iVar20 = iVar21;
        if (iVar20 < 8) {
          stack0xffffffffffffff60 =
               (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_9c,iVar20);
          local_b8._16_8_ = p_Var22;
          break;
        }
        pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
        *(JOCTET *)local_b8._0_8_ = (JOCTET)((ulong)p_Var22 >> 0x10);
        local_b8._8_8_ = local_b8._8_8_ - 1;
        local_b8._0_8_ = pJVar1;
        if (local_b8._8_8_ == 0) {
          pjVar8 = local_88->dest;
          bVar11 = (*pjVar8->empty_output_buffer)(local_88);
          if (bVar11 != 0) {
            local_b8._0_8_ = pjVar8->next_output_byte;
            local_b8._8_8_ = pjVar8->free_in_buffer;
            goto LAB_00116176;
          }
LAB_001161c5:
          bVar9 = false;
          iVar21 = iVar20;
        }
        else {
LAB_00116176:
          if ((~(uint)p_Var22 & 0xff0000) == 0) {
            pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
            *(JOCTET *)local_b8._0_8_ = '\0';
            local_b8._8_8_ = local_b8._8_8_ - 1;
            local_b8._0_8_ = pJVar1;
            if (local_b8._8_8_ == 0) {
              pjVar8 = local_88->dest;
              bVar11 = (*pjVar8->empty_output_buffer)(local_88);
              if (bVar11 == 0) goto LAB_001161c5;
              local_b8._0_8_ = pjVar8->next_output_byte;
              local_b8._8_8_ = pjVar8->free_in_buffer;
            }
          }
          p_Var22 = (_func_void_j_compress_ptr_boolean *)((long)p_Var22 << 8);
          bVar9 = true;
          iVar21 = iVar20 + -8;
        }
      } while (bVar9);
      if (7 < iVar20) {
        return 0;
      }
      if (uVar19 != 0) {
        p_Var22 = (_func_void_j_compress_ptr_boolean *)
                  ((ulong)(~(uint)(-1L << ((byte)local_78 & 0x3f)) &
                          (iVar17 - iVar12 >> 0x1f) + uVar18) <<
                   (0x18U - (char)(uVar19 + local_b8._24_4_) & 0x3f) | local_b8._16_8_);
        iVar12 = uVar19 + local_b8._24_4_;
        do {
          iVar17 = iVar12;
          if (iVar17 < 8) {
            stack0xffffffffffffff60 =
                 (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_9c,iVar17);
            local_b8._16_8_ = p_Var22;
            break;
          }
          pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
          *(JOCTET *)local_b8._0_8_ = (JOCTET)((ulong)p_Var22 >> 0x10);
          local_b8._8_8_ = local_b8._8_8_ - 1;
          local_b8._0_8_ = pJVar1;
          if (local_b8._8_8_ == 0) {
            pjVar8 = local_88->dest;
            bVar11 = (*pjVar8->empty_output_buffer)(local_88);
            if (bVar11 != 0) {
              local_b8._0_8_ = pjVar8->next_output_byte;
              local_b8._8_8_ = pjVar8->free_in_buffer;
              goto LAB_00116264;
            }
LAB_001162b2:
            bVar9 = false;
            iVar12 = iVar17;
          }
          else {
LAB_00116264:
            if ((~(uint)p_Var22 & 0xff0000) == 0) {
              pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
              *(JOCTET *)local_b8._0_8_ = '\0';
              local_b8._8_8_ = local_b8._8_8_ - 1;
              local_b8._0_8_ = pJVar1;
              if (local_b8._8_8_ == 0) {
                pjVar8 = local_88->dest;
                bVar11 = (*pjVar8->empty_output_buffer)(local_88);
                if (bVar11 == 0) goto LAB_001162b2;
                local_b8._0_8_ = pjVar8->next_output_byte;
                local_b8._8_8_ = pjVar8->free_in_buffer;
              }
            }
            p_Var22 = (_func_void_j_compress_ptr_boolean *)((long)p_Var22 << 8);
            bVar9 = true;
            iVar12 = iVar17 + -8;
          }
        } while (bVar9);
        if (7 < iVar17) {
          return 0;
        }
      }
      if (0 < (int)local_80) {
        uVar14 = local_80 + 1;
        iVar12 = 0;
        uVar16 = 1;
        local_80 = uVar14;
        do {
          uVar18 = (uint)(*local_38)[local_40[uVar16]];
          if ((*local_38)[local_40[uVar16]] == 0) {
            iVar12 = iVar12 + 1;
          }
          else {
            local_78 = uVar16;
            iVar17 = iVar12;
            if (0xf < iVar12) {
              do {
                uVar19 = *(uint *)(local_70 + 0x3c0);
                cVar3 = local_70[0x4f0];
                uVar4 = local_b8._24_4_;
                if (cVar3 == (code)0x0) {
                  pjVar7 = local_88->err;
                  pjVar7->msg_code = 0x29;
                  (*pjVar7->error_exit)((j_common_ptr)local_88);
                }
                p_Var22 = (_func_void_j_compress_ptr_boolean *)
                          ((ulong)(uVar19 & ~(uint)(-1L << ((byte)cVar3 & 0x3f))) <<
                           (0x18U - (char)(uVar4 + (int)(char)cVar3) & 0x3f) | local_b8._16_8_);
                iVar12 = uVar4 + (int)(char)cVar3;
                do {
                  iVar21 = iVar12;
                  if (iVar21 < 8) {
                    stack0xffffffffffffff60 =
                         (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_9c,iVar21);
                    local_b8._16_8_ = p_Var22;
                    break;
                  }
                  pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
                  *(JOCTET *)local_b8._0_8_ = (JOCTET)((ulong)p_Var22 >> 0x10);
                  local_b8._8_8_ = local_b8._8_8_ - 1;
                  local_b8._0_8_ = pJVar1;
                  if (local_b8._8_8_ == 0) {
                    pjVar8 = local_88->dest;
                    bVar11 = (*pjVar8->empty_output_buffer)(local_88);
                    if (bVar11 != 0) {
                      local_b8._0_8_ = pjVar8->next_output_byte;
                      local_b8._8_8_ = pjVar8->free_in_buffer;
                      goto LAB_001163b2;
                    }
LAB_00116400:
                    bVar9 = false;
                    iVar12 = iVar21;
                  }
                  else {
LAB_001163b2:
                    if ((~(uint)p_Var22 & 0xff0000) == 0) {
                      pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
                      *(JOCTET *)local_b8._0_8_ = '\0';
                      local_b8._8_8_ = local_b8._8_8_ - 1;
                      local_b8._0_8_ = pJVar1;
                      if (local_b8._8_8_ == 0) {
                        pjVar8 = local_88->dest;
                        bVar11 = (*pjVar8->empty_output_buffer)(local_88);
                        if (bVar11 == 0) goto LAB_00116400;
                        local_b8._0_8_ = pjVar8->next_output_byte;
                        local_b8._8_8_ = pjVar8->free_in_buffer;
                      }
                    }
                    p_Var22 = (_func_void_j_compress_ptr_boolean *)((long)p_Var22 << 8);
                    bVar9 = true;
                    iVar12 = iVar21 + -8;
                  }
                } while (bVar9);
                if (7 < iVar21) {
                  return 0;
                }
                iVar12 = iVar17 + -0x10;
                bVar9 = 0x1f < iVar17;
                iVar17 = iVar12;
              } while (bVar9);
            }
            uVar19 = -uVar18;
            if (0 < (int)uVar18) {
              uVar19 = uVar18;
            }
            uVar15 = 0x1f;
            if (uVar19 != 0) {
              for (; uVar19 >> uVar15 == 0; uVar15 = uVar15 - 1) {
              }
            }
            uVar15 = (uVar15 ^ 0xffffffe0) + 0x21;
            if (uVar19 < 2) {
              uVar15 = 1;
            }
            if (10 < uVar15) {
              pjVar7 = local_88->err;
              pjVar7->msg_code = 6;
              (*pjVar7->error_exit)((j_common_ptr)local_88);
            }
            lVar13 = (long)(int)(iVar12 * 0x10 + uVar15);
            uVar19 = *(uint *)(local_70 + lVar13 * 4);
            bVar2 = (byte)local_70[lVar13 + 0x400];
            uVar4 = local_b8._24_4_;
            if (bVar2 == 0) {
              pjVar7 = local_88->err;
              pjVar7->msg_code = 0x29;
              (*pjVar7->error_exit)((j_common_ptr)local_88);
            }
            p_Var22 = (_func_void_j_compress_ptr_boolean *)
                      ((ulong)(uVar19 & ~(uint)(-1L << (bVar2 & 0x3f))) <<
                       (0x18U - (char)(uVar4 + (int)(char)bVar2) & 0x3f) | local_b8._16_8_);
            iVar12 = uVar4 + (int)(char)bVar2;
            do {
              iVar17 = iVar12;
              if (iVar17 < 8) {
                stack0xffffffffffffff60 =
                     (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_9c,iVar17);
                local_b8._16_8_ = p_Var22;
                break;
              }
              pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
              *(JOCTET *)local_b8._0_8_ = (JOCTET)((ulong)p_Var22 >> 0x10);
              local_b8._8_8_ = local_b8._8_8_ - 1;
              local_b8._0_8_ = pJVar1;
              if (local_b8._8_8_ == 0) {
                pjVar8 = local_88->dest;
                bVar11 = (*pjVar8->empty_output_buffer)(local_88);
                if (bVar11 != 0) {
                  local_b8._0_8_ = pjVar8->next_output_byte;
                  local_b8._8_8_ = pjVar8->free_in_buffer;
                  goto LAB_00116510;
                }
LAB_0011655e:
                bVar9 = false;
                iVar12 = iVar17;
              }
              else {
LAB_00116510:
                if ((~(uint)p_Var22 & 0xff0000) == 0) {
                  pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
                  *(JOCTET *)local_b8._0_8_ = '\0';
                  local_b8._8_8_ = local_b8._8_8_ - 1;
                  local_b8._0_8_ = pJVar1;
                  if (local_b8._8_8_ == 0) {
                    pjVar8 = local_88->dest;
                    bVar11 = (*pjVar8->empty_output_buffer)(local_88);
                    if (bVar11 == 0) goto LAB_0011655e;
                    local_b8._0_8_ = pjVar8->next_output_byte;
                    local_b8._8_8_ = pjVar8->free_in_buffer;
                  }
                }
                p_Var22 = (_func_void_j_compress_ptr_boolean *)((long)p_Var22 << 8);
                bVar9 = true;
                iVar12 = iVar17 + -8;
              }
            } while (bVar9);
            if (7 < iVar17) {
              return 0;
            }
            p_Var22 = (_func_void_j_compress_ptr_boolean *)
                      ((ulong)(~(uint)(-1L << ((byte)uVar15 & 0x3f)) & ((int)uVar18 >> 0xf) + uVar18
                              ) << (0x18U - (char)(uVar15 + local_b8._24_4_) & 0x3f) |
                      local_b8._16_8_);
            iVar12 = uVar15 + local_b8._24_4_;
            do {
              iVar17 = iVar12;
              if (iVar17 < 8) {
                stack0xffffffffffffff60 =
                     (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_9c,iVar17);
                local_b8._16_8_ = p_Var22;
                break;
              }
              pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
              *(JOCTET *)local_b8._0_8_ = (JOCTET)((ulong)p_Var22 >> 0x10);
              local_b8._8_8_ = local_b8._8_8_ - 1;
              local_b8._0_8_ = pJVar1;
              if (local_b8._8_8_ == 0) {
                pjVar8 = local_88->dest;
                bVar11 = (*pjVar8->empty_output_buffer)(local_88);
                if (bVar11 != 0) {
                  local_b8._0_8_ = pjVar8->next_output_byte;
                  local_b8._8_8_ = pjVar8->free_in_buffer;
                  goto LAB_001165f2;
                }
LAB_00116641:
                bVar9 = false;
                iVar12 = iVar17;
              }
              else {
LAB_001165f2:
                if ((~(uint)p_Var22 & 0xff0000) == 0) {
                  pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
                  *(JOCTET *)local_b8._0_8_ = '\0';
                  local_b8._8_8_ = local_b8._8_8_ - 1;
                  local_b8._0_8_ = pJVar1;
                  if (local_b8._8_8_ == 0) {
                    pjVar8 = local_88->dest;
                    bVar11 = (*pjVar8->empty_output_buffer)(local_88);
                    if (bVar11 == 0) goto LAB_00116641;
                    local_b8._0_8_ = pjVar8->next_output_byte;
                    local_b8._8_8_ = pjVar8->free_in_buffer;
                  }
                }
                p_Var22 = (_func_void_j_compress_ptr_boolean *)((long)p_Var22 << 8);
                bVar9 = true;
                iVar12 = iVar17 + -8;
              }
            } while (bVar9);
            iVar12 = 0;
            uVar14 = local_80;
            uVar16 = local_78;
            if (7 < iVar17) {
              return 0;
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar14);
        if (0 < iVar12) {
          uVar18 = *(uint *)local_70;
          cVar3 = local_70[0x400];
          uVar4 = local_b8._24_4_;
          if (cVar3 == (code)0x0) {
            pjVar7 = local_88->err;
            pjVar7->msg_code = 0x29;
            (*pjVar7->error_exit)((j_common_ptr)local_88);
          }
          p_Var22 = (_func_void_j_compress_ptr_boolean *)
                    ((ulong)(uVar18 & ~(uint)(-1L << ((byte)cVar3 & 0x3f))) <<
                     (0x18U - (char)(uVar4 + (int)(char)cVar3) & 0x3f) | local_b8._16_8_);
          iVar12 = uVar4 + (int)(char)cVar3;
          do {
            iVar17 = iVar12;
            if (iVar17 < 8) {
              stack0xffffffffffffff60 =
                   (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_9c,iVar17);
              local_b8._16_8_ = p_Var22;
              break;
            }
            pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
            *(JOCTET *)local_b8._0_8_ = (JOCTET)((ulong)p_Var22 >> 0x10);
            local_b8._8_8_ = local_b8._8_8_ - 1;
            local_b8._0_8_ = pJVar1;
            if (local_b8._8_8_ == 0) {
              pjVar8 = local_88->dest;
              bVar11 = (*pjVar8->empty_output_buffer)(local_88);
              if (bVar11 != 0) {
                local_b8._0_8_ = pjVar8->next_output_byte;
                local_b8._8_8_ = pjVar8->free_in_buffer;
                goto LAB_00116716;
              }
LAB_00116764:
              bVar9 = false;
              iVar12 = iVar17;
            }
            else {
LAB_00116716:
              if ((~(uint)p_Var22 & 0xff0000) == 0) {
                pJVar1 = (JOCTET *)(local_b8._0_8_ + 1);
                *(JOCTET *)local_b8._0_8_ = '\0';
                local_b8._8_8_ = local_b8._8_8_ - 1;
                local_b8._0_8_ = pJVar1;
                if (local_b8._8_8_ == 0) {
                  pjVar8 = local_88->dest;
                  bVar11 = (*pjVar8->empty_output_buffer)(local_88);
                  if (bVar11 == 0) goto LAB_00116764;
                  local_b8._0_8_ = pjVar8->next_output_byte;
                  local_b8._8_8_ = pjVar8->free_in_buffer;
                }
              }
              p_Var22 = (_func_void_j_compress_ptr_boolean *)((long)p_Var22 << 8);
              bVar9 = true;
              iVar12 = iVar17 + -8;
            }
          } while (bVar9);
          if (7 < iVar17) {
            return 0;
          }
        }
      }
      MCU_data = local_68;
      (&iStack_9c)[local_50] = (int)(*local_68[local_48])[0];
      local_48 = local_48 + 1;
      cinfo = local_60;
    } while (local_48 < local_60->blocks_in_MCU);
  }
  pjVar8 = cinfo->dest;
  pjVar8->next_output_byte = (JOCTET *)local_b8._0_8_;
  pjVar8->free_in_buffer = local_b8._8_8_;
  local_58[1].finish_pass = local_98;
  local_58[2].start_pass = p_Stack_90;
  local_58[1].start_pass = (_func_void_j_compress_ptr_boolean *)local_b8._16_8_;
  local_58[1].encode_mcu = stack0xffffffffffffff60;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&local_58[2].encode_mcu == 0) {
      *(uint *)&local_58[2].encode_mcu = cinfo->restart_interval;
      *(uint *)((long)&local_58[2].encode_mcu + 4) =
           *(int *)((long)&local_58[2].encode_mcu + 4) + 1U & 7;
    }
    *(int *)&local_58[2].encode_mcu = *(int *)&local_58[2].encode_mcu + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  ASSIGN_STATE(state.cur, entropy->saved);
  state.cinfo = cinfo;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! emit_restart_s(&state, entropy->next_restart_num))
	return FALSE;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    if (! encode_one_block(&state,
			   MCU_data[blkn][0], state.cur.last_dc_val[ci],
			   entropy->dc_derived_tbls[compptr->dc_tbl_no],
			   entropy->ac_derived_tbls[compptr->ac_tbl_no]))
      return FALSE;
    /* Update last_dc_val */
    state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  ASSIGN_STATE(entropy->saved, state.cur);

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}